

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

size_t HTS_fread(void *buf,size_t size,size_t n,HTS_File *fp)

{
  long *plVar1;
  long lVar2;
  char *in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  void *in_RDI;
  uchar *c;
  size_t length;
  size_t i;
  HTS_Data *d;
  ulong local_38;
  size_t local_8;
  
  if (((in_RCX == (char *)0x0) || (in_RSI == 0)) || (in_RDX == 0)) {
    local_8 = 0;
  }
  else if (*in_RCX == '\0') {
    local_8 = fread(in_RDI,in_RSI,in_RDX,*(FILE **)(in_RCX + 8));
  }
  else if (*in_RCX == '\x01') {
    plVar1 = *(long **)(in_RCX + 8);
    local_38 = 0;
    while ((local_38 < in_RSI * in_RDX && ((ulong)plVar1[2] < (ulong)plVar1[1]))) {
      lVar2 = plVar1[2];
      plVar1[2] = lVar2 + 1;
      *(undefined1 *)((long)in_RDI + local_38) = *(undefined1 *)(*plVar1 + lVar2);
      local_38 = local_38 + 1;
    }
    if (local_38 == 0) {
      local_8 = 0;
    }
    else {
      local_8 = local_38 / in_RSI;
    }
  }
  else {
    HTS_error(0,"HTS_fread: Unknown file type.\n");
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static size_t HTS_fread(void *buf, size_t size, size_t n, HTS_File * fp)
{
   if (fp == NULL || size == 0 || n == 0) {
      return 0;
   }
   if (fp->type == HTS_FILE) {
      return fread(buf, size, n, (FILE *) fp->pointer);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      size_t i, length = size * n;
      unsigned char *c = (unsigned char *) buf;
      for (i = 0; i < length; i++) {
         if (d->index < d->size)
            c[i] = d->data[d->index++];
         else
            break;
      }
      if (i == 0)
         return 0;
      else
         return i / size;
   }
   HTS_error(0, "HTS_fread: Unknown file type.\n");
   return 0;
}